

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

void __thiscall
VGMPlayer::RefreshDevOptions(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_DEV_OPTS *devOpts)

{
  UINT8 UVar1;
  uint local_34;
  UINT32 coreOpts;
  DEV_INFO *devInf;
  UINT8 chipType;
  PLR_DEV_OPTS *devOpts_local;
  CHIP_DEVICE *chipDev_local;
  VGMPlayer *this_local;
  
  UVar1 = chipDev->chipType;
  if (((chipDev->base).defInf.devDef)->SetOptionBits != (DEVFUNC_OPTMASK)0x0) {
    local_34 = devOpts->coreOpts;
    if (UVar1 == '\x02') {
      if (chipDev->flags != 0) {
        local_34 = local_34 & 0xffffffcf | 0x10;
      }
      if ((this->_p2612Fix & 1) != 0) {
        local_34 = local_34 | 0x80;
      }
    }
    else if (UVar1 == '\x13') {
      local_34 = local_34 | 0x80;
    }
    else if (UVar1 == '\x1f') {
      local_34 = local_34 | 1;
    }
    (*((chipDev->base).defInf.devDef)->SetOptionBits)((chipDev->base).defInf.dataPtr,local_34);
  }
  return;
}

Assistant:

void VGMPlayer::RefreshDevOptions(CHIP_DEVICE& chipDev, const PLR_DEV_OPTS& devOpts)
{
	UINT8 chipType = chipDev.chipType;
	DEV_INFO* devInf = &chipDev.base.defInf;
	if (devInf->devDef->SetOptionBits == NULL)
		return;
	
	UINT32 coreOpts = devOpts.coreOpts;
	if (chipType == DEVID_YM2612)
	{
		if (chipDev.flags)
			coreOpts = (coreOpts & ~0x30) | OPT_YM2612_TYPE_OPN2C_ASIC;	// enforce YM3438 mode
		if (_p2612Fix & P2612FIX_ACTIVE)
			coreOpts |= OPT_YM2612_LEGACY_MODE;	// enable legacy mode
	}
	else if (chipType == DEVID_GB_DMG)
		coreOpts |= OPT_GB_DMG_LEGACY_MODE;	// enable legacy mode (fix playback of old VGMs)
	else if (chipType == DEVID_QSOUND)
		coreOpts |= OPT_QSOUND_NOWAIT;	// make sure seeking works
	
	devInf->devDef->SetOptionBits(devInf->dataPtr, coreOpts);
	return;
}